

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::DetectionOutput::load_param(DetectionOutput *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0x80) = iVar1;
  fVar2 = ParamDict::get(in_RSI,1,0.05);
  *(float *)(in_RDI + 0x84) = fVar2;
  iVar1 = ParamDict::get(in_RSI,2,300);
  *(int *)(in_RDI + 0x88) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,100);
  *(int *)(in_RDI + 0x8c) = iVar1;
  fVar2 = ParamDict::get(in_RSI,4,0.5);
  *(float *)(in_RDI + 0x90) = fVar2;
  fVar2 = ParamDict::get(in_RSI,5,0.1);
  *(float *)(in_RDI + 0x94) = fVar2;
  fVar2 = ParamDict::get(in_RSI,6,0.1);
  *(float *)(in_RDI + 0x98) = fVar2;
  fVar2 = ParamDict::get(in_RSI,7,0.2);
  *(float *)(in_RDI + 0x9c) = fVar2;
  fVar2 = ParamDict::get(in_RSI,8,0.2);
  *(float *)(in_RDI + 0xa0) = fVar2;
  return 0;
}

Assistant:

int DetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 0);
    nms_threshold = pd.get(1, 0.05f);
    nms_top_k = pd.get(2, 300);
    keep_top_k = pd.get(3, 100);
    confidence_threshold = pd.get(4, 0.5f);
    variances[0] = pd.get(5, 0.1f);
    variances[1] = pd.get(6, 0.1f);
    variances[2] = pd.get(7, 0.2f);
    variances[3] = pd.get(8, 0.2f);

    return 0;
}